

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composite_command.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  initializer_list<std::shared_ptr<ICommand>_> *local_c8;
  int local_ac;
  shared_ptr<Command> local_a8 [2];
  undefined4 local_88;
  int local_84;
  shared_ptr<Command> local_80;
  initializer_list<std::shared_ptr<ICommand>_> *local_70;
  initializer_list<std::shared_ptr<ICommand>_> local_68;
  shared_ptr<ICommand> local_58;
  initializer_list<std::shared_ptr<ICommand>_> local_48;
  undefined1 local_38 [8];
  CommandList commands;
  BankAccount ba;
  
  commands.super_vector<std::shared_ptr<ICommand>,_std::allocator<std::shared_ptr<ICommand>_>_>.
  super__Vector_base<std::shared_ptr<ICommand>,_std::allocator<std::shared_ptr<ICommand>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage._4_4_ = 1000;
  local_70 = &local_68;
  local_84 = 0;
  local_88 = 100;
  std::make_shared<Command,BankAccount&,Command::Action,int>
            ((BankAccount *)&local_80,
             (Action *)
             ((long)&commands.
                     super_vector<std::shared_ptr<ICommand>,_std::allocator<std::shared_ptr<ICommand>_>_>
                     .
                     super__Vector_base<std::shared_ptr<ICommand>,_std::allocator<std::shared_ptr<ICommand>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),&local_84);
  std::shared_ptr<ICommand>::shared_ptr<Command,void>((shared_ptr<ICommand> *)&local_68,&local_80);
  local_ac = 1;
  local_70 = (initializer_list<std::shared_ptr<ICommand>_> *)&local_58;
  std::make_shared<Command,BankAccount&,Command::Action,int>
            ((BankAccount *)local_a8,
             (Action *)
             ((long)&commands.
                     super_vector<std::shared_ptr<ICommand>,_std::allocator<std::shared_ptr<ICommand>_>_>
                     .
                     super__Vector_base<std::shared_ptr<ICommand>,_std::allocator<std::shared_ptr<ICommand>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),&local_ac);
  std::shared_ptr<ICommand>::shared_ptr<Command,void>(&local_58,local_a8);
  local_48._M_array = (iterator)&local_68;
  local_48._M_len = 2;
  CommandList::CommandList((CommandList *)local_38,&local_48);
  local_c8 = &local_48;
  do {
    local_c8 = local_c8 + -1;
    std::shared_ptr<ICommand>::~shared_ptr((shared_ptr<ICommand> *)local_c8);
  } while (local_c8 != &local_68);
  std::shared_ptr<Command>::~shared_ptr(local_a8);
  std::shared_ptr<Command>::~shared_ptr(&local_80);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,
                      commands.
                      super_vector<std::shared_ptr<ICommand>,_std::allocator<std::shared_ptr<ICommand>_>_>
                      .
                      super__Vector_base<std::shared_ptr<ICommand>,_std::allocator<std::shared_ptr<ICommand>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  CommandList::invoke((CommandList *)local_38);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,
                      commands.
                      super_vector<std::shared_ptr<ICommand>,_std::allocator<std::shared_ptr<ICommand>_>_>
                      .
                      super__Vector_base<std::shared_ptr<ICommand>,_std::allocator<std::shared_ptr<ICommand>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  CommandList::undo((CommandList *)local_38);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,
                      commands.
                      super_vector<std::shared_ptr<ICommand>,_std::allocator<std::shared_ptr<ICommand>_>_>
                      .
                      super__Vector_base<std::shared_ptr<ICommand>,_std::allocator<std::shared_ptr<ICommand>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  CommandList::~CommandList((CommandList *)local_38);
  return 0;
}

Assistant:

int main()
{
	BankAccount ba{1000};
	CommandList commands{
		std::make_shared<Command>(ba, Command::Action::Deposit, 100),
		std::make_shared<Command>(ba, Command::Action::Withdraw, 200),
	};

	std::cout << ba.balance << std::endl;
	commands.invoke();
	std::cout << ba.balance << std::endl;
	commands.undo();
	std::cout << ba.balance << std::endl;

	return 0;
}